

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCEncoder.cpp
# Opt level: O0

bool __thiscall gnilk::IPCBinaryEncoder::BeginArray(IPCBinaryEncoder *this,uint16_t num)

{
  IPCArrayHeader local_16;
  uint16_t local_12;
  IPCArrayHeader arrayHeader;
  IPCBinaryEncoder *pIStack_10;
  uint16_t num_local;
  IPCBinaryEncoder *this_local;
  
  local_12 = num;
  pIStack_10 = this;
  IPCArrayHeader::IPCArrayHeader(&local_16);
  local_16.headerVersion = '\x01';
  local_16.reserved = '\0';
  local_16.num = local_12;
  (**(this->super_IPCEncoderBase).super_IPCWriter._vptr_IPCWriter)(this,&local_16,4);
  return true;
}

Assistant:

bool IPCBinaryEncoder::BeginArray(uint16_t num) {
    IPCArrayHeader arrayHeader;
    arrayHeader.headerVersion = kMsgVer_Current;
    arrayHeader.reserved = 0;
    arrayHeader.num = num;
    Write(&arrayHeader, sizeof(arrayHeader));
    return true;
}